

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr **ppPVar1;
  uint uVar2;
  PgHdr *pPVar3;
  PgHdr *pPVar4;
  PgHdr *pPVar5;
  PgHdr *pPVar6;
  long lVar7;
  PgHdr *pPVar8;
  PgHdr *pPVar9;
  long in_FS_OFFSET;
  bool bVar10;
  undefined1 local_168 [56];
  undefined1 *puStack_130;
  PgHdr *local_128;
  PgHdr *pPStack_120;
  PgHdr *local_118 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar8 = pCache->pDirty;
  while (pPVar8 != (PgHdr *)0x0) {
    pPVar8->pDirty = pPVar8->pDirtyNext;
    pPVar8 = pPVar8->pDirtyNext;
  }
  pPVar8 = pCache->pDirty;
  memset(local_118,0xaa,0x100);
  memset(local_118,0,0x100);
  do {
    if (pPVar8 == (PgHdr *)0x0) {
      lVar7 = 1;
      do {
        pPVar8 = local_118[lVar7];
        pPVar3 = local_118[0];
        if ((pPVar8 != (PgHdr *)0x0) && (pPVar3 = pPVar8, local_118[0] != (PgHdr *)0x0)) {
          local_128 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
          pPStack_120 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
          local_168._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
          local_168._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_168._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_168._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_168._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pPVar3 = (PgHdr *)local_168;
          do {
            pPVar5 = local_118[0];
            uVar2 = pPVar5->pgno;
            while (pPVar8->pgno <= uVar2) {
              pPVar3->pDirty = pPVar8;
              ppPVar1 = &pPVar8->pDirty;
              pPVar9 = pPVar5;
              pPVar3 = pPVar8;
              pPVar8 = *ppPVar1;
              if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0013bfc1;
            }
            pPVar3->pDirty = pPVar5;
            local_118[0] = pPVar5->pDirty;
            pPVar9 = pPVar8;
            pPVar3 = pPVar5;
          } while (pPVar5->pDirty != (PgHdr *)0x0);
LAB_0013bfc1:
          pPVar3->pDirty = pPVar9;
          pPVar3 = (PgHdr *)local_168._32_8_;
        }
        lVar7 = lVar7 + 1;
        local_118[0] = pPVar3;
        if (lVar7 == 0x20) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
            return pPVar3;
          }
          __stack_chk_fail();
        }
      } while( true );
    }
    pPVar3 = pPVar8->pDirty;
    pPVar8->pDirty = (PgHdr *)0x0;
    lVar7 = 0;
    pPVar5 = pPVar8;
    do {
      if (local_118[lVar7] == (PgHdr *)0x0) {
        local_118[lVar7] = pPVar5;
        bVar10 = lVar7 == 0x1f;
        goto LAB_0013bec4;
      }
      local_128 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      pPStack_120 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      local_168._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_168._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pPVar8 = (PgHdr *)local_168;
      pPVar9 = local_118[lVar7];
      do {
        pPVar6 = pPVar9;
        uVar2 = pPVar6->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar8->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar4 = pPVar6;
          pPVar8 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0013be99;
        }
        pPVar8->pDirty = pPVar6;
        pPVar4 = pPVar5;
        pPVar8 = pPVar6;
        pPVar9 = pPVar6->pDirty;
      } while (pPVar6->pDirty != (PgHdr *)0x0);
LAB_0013be99:
      pPVar8->pDirty = pPVar4;
      local_118[lVar7] = (PgHdr *)0x0;
      lVar7 = lVar7 + 1;
      pPVar5 = (PgHdr *)local_168._32_8_;
    } while (lVar7 != 0x1f);
    bVar10 = true;
LAB_0013bec4:
    pPVar8 = pPVar3;
    if (bVar10) {
      local_128 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      pPStack_120 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      local_168._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_168._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pPVar3 = (PgHdr *)local_168;
      do {
        pPVar9 = local_118[0x1f];
        uVar2 = pPVar9->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar3->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar6 = pPVar9;
          pPVar3 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0013bf2a;
        }
        pPVar3->pDirty = pPVar9;
        pPVar6 = pPVar5;
        pPVar3 = pPVar9;
        local_118[0x1f] = pPVar9->pDirty;
      } while (pPVar9->pDirty != (PgHdr *)0x0);
LAB_0013bf2a:
      pPVar3->pDirty = pPVar6;
      local_118[0x1f] = (PgHdr *)local_168._32_8_;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}